

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int put_bit(bitstream *str,h264_cabac_context *cabac,uint32_t bit)

{
  int iVar1;
  uint local_28;
  uint32_t local_24;
  uint32_t nbit;
  uint32_t bit_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  local_28 = (uint)((bit != 0 ^ 0xffU) & 1);
  local_24 = bit;
  _nbit = cabac;
  cabac_local = (h264_cabac_context *)str;
  if (cabac->firstBitFlag == 0) {
    iVar1 = vs_u(str,&local_24,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    cabac->firstBitFlag = 0;
    if (bit != 0) {
      fprintf(_stderr,"CABAC initial skipped bit not 0\n");
      return 1;
    }
  }
  do {
    if (_nbit->bitsOutstanding == 0) {
      return 0;
    }
    _nbit->bitsOutstanding = _nbit->bitsOutstanding + -1;
    iVar1 = vs_u((bitstream *)cabac_local,&local_28,1);
  } while (iVar1 == 0);
  return 1;
}

Assistant:

static int put_bit(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t bit) {
	uint32_t nbit = !bit;
	if (cabac->firstBitFlag) {
		cabac->firstBitFlag = 0;
		if (bit != 0) {
			fprintf (stderr, "CABAC initial skipped bit not 0\n");
			return 1;
		}
	} else {
		if (vs_u(str, &bit, 1))
			return 1;
	}
	while (cabac->bitsOutstanding) {
		cabac->bitsOutstanding--;
		if (vs_u(str, &nbit, 1))
			return 1;
	}
	return 0;
}